

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

ssize_t Curl_send_plain(Curl_easy *data,int num,void *mem,size_t len,CURLcode *code)

{
  int err_00;
  int *piVar1;
  char *pcVar2;
  char local_158 [8];
  char buffer [256];
  ssize_t sStack_48;
  int err;
  ssize_t bytes_written;
  curl_socket_t sockfd;
  connectdata *conn;
  CURLcode *code_local;
  size_t len_local;
  void *mem_local;
  int num_local;
  Curl_easy *data_local;
  
  sStack_48 = send(data->conn->sock[num],mem,len,0x4000);
  *code = CURLE_OK;
  if (sStack_48 == -1) {
    piVar1 = __errno_location();
    err_00 = *piVar1;
    if ((((err_00 == 0xb) || (err_00 == 0xb)) || (err_00 == 4)) || (err_00 == 0x73)) {
      sStack_48 = 0;
      *code = CURLE_AGAIN;
    }
    else {
      pcVar2 = Curl_strerror(err_00,local_158,0x100);
      Curl_failf(data,"Send failure: %s",pcVar2);
      (data->state).os_errno = err_00;
      *code = CURLE_SEND_ERROR;
    }
  }
  return sStack_48;
}

Assistant:

ssize_t Curl_send_plain(struct Curl_easy *data, int num,
                        const void *mem, size_t len, CURLcode *code)
{
  struct connectdata *conn;
  curl_socket_t sockfd;
  ssize_t bytes_written;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
  sockfd = conn->sock[num];
  /* WinSock will destroy unread received data if send() is
     failed.
     To avoid lossage of received data, recv() must be
     performed before every send() if any incoming data is
     available. */
  if(pre_receive_plain(data, conn, num)) {
    *code = CURLE_OUT_OF_MEMORY;
    return -1;
  }

#if defined(MSG_FASTOPEN) && !defined(TCP_FASTOPEN_CONNECT) /* Linux */
  if(conn->bits.tcp_fastopen) {
    bytes_written = sendto(sockfd, mem, len, MSG_FASTOPEN,
                           conn->ip_addr->ai_addr, conn->ip_addr->ai_addrlen);
    conn->bits.tcp_fastopen = FALSE;
  }
  else
#endif
    bytes_written = swrite(sockfd, mem, len);

  *code = CURLE_OK;
  if(-1 == bytes_written) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err) ||
      (EINPROGRESS == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      bytes_written = 0;
      *code = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(data, "Send failure: %s",
            Curl_strerror(err, buffer, sizeof(buffer)));
      data->state.os_errno = err;
      *code = CURLE_SEND_ERROR;
    }
  }
  return bytes_written;
}